

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O2

int test_xmlschemastypes(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  xmlChar *pxVar8;
  ulong uVar9;
  ulong uVar10;
  undefined8 uVar11;
  int nr;
  int nr_00;
  int test_ret_3;
  char *pcVar12;
  int test_ret;
  int iVar13;
  xmlNodePtr in_RSI;
  xmlNodePtr pxVar14;
  undefined8 uVar15;
  int n_value_1;
  uint uVar16;
  undefined4 uVar17;
  bool bVar18;
  ulong uVar19;
  int test_ret_6;
  undefined4 uVar20;
  int n_value;
  uint uVar21;
  int local_74;
  int test_ret_1;
  int test_ret_4;
  int local_48;
  int local_44;
  int test_ret_5;
  int local_3c;
  
  if (quiet == '\0') {
    puts("Testing xmlschemastypes : 26 of 34 functions ...");
  }
  bVar18 = true;
  iVar13 = 0;
  while (bVar18) {
    pxVar14 = (xmlNodePtr)0x1;
    while (pxVar14 != (xmlNodePtr)0x0) {
      bVar18 = true;
      while (pxVar14 = (xmlNodePtr)0x0, bVar18) {
        while( true ) {
          iVar2 = (int)in_RSI;
          iVar3 = (int)pxVar14;
          if (iVar3 == 5) break;
          iVar1 = xmlMemBlocks();
          gen_const_xmlChar_ptr(iVar3,iVar2);
          in_RSI = (xmlNodePtr)0x0;
          xmlSchemaCheckFacet(0,0,0);
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar2 = xmlMemBlocks();
          if (iVar1 != iVar2) {
            iVar2 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlSchemaCheckFacet",(ulong)(uint)(iVar2 - iVar1));
            iVar13 = iVar13 + 1;
            printf(" %d",0);
            printf(" %d",0);
            printf(" %d",0);
            printf(" %d");
            putchar(10);
            in_RSI = pxVar14;
          }
          pxVar14 = (xmlNodePtr)(ulong)(iVar3 + 1);
        }
        bVar18 = false;
      }
    }
    bVar18 = false;
  }
  function_tests = function_tests + 1;
  xmlSchemaCleanupTypes();
  call_tests = call_tests + 1;
  xmlResetLastError();
  function_tests = function_tests + 1;
  iVar2 = 0;
  for (uVar21 = 0; uVar21 != 5; uVar21 = uVar21 + 1) {
    iVar3 = xmlMemBlocks();
    gen_const_xmlChar_ptr(uVar21,(int)in_RSI);
    lVar7 = xmlSchemaCollapseString();
    if (lVar7 != 0) {
      (*_xmlFree)();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar1 = xmlMemBlocks();
    if (iVar3 != iVar1) {
      iVar1 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSchemaCollapseString",(ulong)(uint)(iVar1 - iVar3));
      iVar2 = iVar2 + 1;
      in_RSI = (xmlNodePtr)(ulong)uVar21;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  iVar3 = 0;
  bVar18 = true;
LAB_001403f3:
  if (bVar18) {
    bVar18 = true;
    while (bVar18) {
      iVar1 = xmlMemBlocks();
      bVar18 = false;
      in_RSI = (xmlNodePtr)0x0;
      xmlSchemaCompareValues();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar4 = xmlMemBlocks();
      if (iVar1 == iVar4) goto LAB_001403f3;
      xmlMemBlocks();
      bVar18 = false;
      printf("Leak of %d blocks found in xmlSchemaCompareValues");
      iVar3 = iVar3 + 1;
      printf(" %d");
      in_RSI = (xmlNodePtr)0x0;
      printf(" %d");
      putchar(10);
    }
    bVar18 = false;
    goto LAB_001403f3;
  }
  function_tests = function_tests + 1;
  bVar18 = true;
  iVar1 = 0;
  while (bVar18) {
    uVar9 = 0;
    while (iVar4 = (int)uVar9, iVar4 != 4) {
      bVar18 = true;
      while (bVar18) {
        pxVar14 = (xmlNodePtr)0xffffffffffffffff;
        while( true ) {
          bVar18 = false;
          uVar21 = 0;
          uVar16 = (uint)pxVar14;
          if (uVar16 == 3) break;
          iVar5 = xmlMemBlocks();
          if (iVar4 - 1U < 3) {
            uVar21 = *(uint *)(&DAT_001510c8 + (ulong)(iVar4 - 1U) * 4);
          }
          uVar20 = 0;
          if (uVar16 < 3) {
            uVar20 = *(undefined4 *)(&DAT_001510c8 + ((ulong)pxVar14 & 0xffffffff) * 4);
          }
          pxVar14 = (xmlNodePtr)(ulong)(uVar16 + 1);
          in_RSI = (xmlNodePtr)(ulong)uVar21;
          xmlSchemaCompareValuesWhtsp(0,in_RSI,0,uVar20);
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar6 = xmlMemBlocks();
          if (iVar5 != iVar6) {
            iVar6 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlSchemaCompareValuesWhtsp",
                   (ulong)(uint)(iVar6 - iVar5));
            iVar1 = iVar1 + 1;
            printf(" %d",0);
            printf(" %d",uVar9);
            printf(" %d",0);
            in_RSI = pxVar14;
            printf(" %d");
            putchar(10);
          }
        }
      }
      uVar9 = (ulong)(iVar4 + 1);
    }
    bVar18 = false;
  }
  function_tests = function_tests + 1;
  iVar13 = iVar3 + iVar1 + iVar13 + iVar2;
  bVar18 = true;
  while (bVar18) {
    iVar2 = xmlMemBlocks();
    xmlSchemaGetBuiltInListSimpleTypeItemType(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar3 = xmlMemBlocks();
    if (iVar2 == iVar3) break;
    xmlMemBlocks();
    bVar18 = false;
    printf("Leak of %d blocks found in xmlSchemaGetBuiltInListSimpleTypeItemType");
    in_RSI = (xmlNodePtr)0x0;
    printf(" %d");
    putchar(10);
    iVar13 = iVar13 + 1;
  }
  function_tests = function_tests + 1;
  iVar2 = 0;
  do {
    uVar15 = 0x2e;
    switch(iVar2) {
    case 1:
      break;
    case 2:
      uVar15 = 0x2d;
      break;
    case 3:
      uVar15 = 0x1d;
      break;
    case 4:
      goto switchD_00140622_caseD_4;
    default:
      uVar15 = 0;
    }
    xmlSchemaGetBuiltInType(uVar15);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar2 = iVar2 + 1;
  } while( true );
switchD_00140622_caseD_4:
  function_tests = function_tests + 1;
  local_74 = 0;
  bVar18 = true;
LAB_00140666:
  if (bVar18) {
    bVar18 = true;
    while (bVar18) {
      iVar2 = xmlMemBlocks();
      bVar18 = false;
      in_RSI = (xmlNodePtr)0x0;
      xmlSchemaGetCanonValue();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar3 = xmlMemBlocks();
      if (iVar2 == iVar3) goto LAB_00140666;
      xmlMemBlocks();
      bVar18 = false;
      printf("Leak of %d blocks found in xmlSchemaGetCanonValue");
      local_74 = local_74 + 1;
      printf(" %d");
      in_RSI = (xmlNodePtr)0x0;
      printf(" %d");
      putchar(10);
    }
    bVar18 = false;
    goto LAB_00140666;
  }
  function_tests = function_tests + 1;
  bVar18 = true;
  iVar2 = 0;
  while (bVar18) {
    iVar3 = 1;
    while (iVar3 != 0) {
      pxVar14 = (xmlNodePtr)0xffffffffffffffff;
      while( true ) {
        iVar3 = 0;
        uVar21 = (uint)pxVar14;
        if (uVar21 == 3) break;
        iVar1 = xmlMemBlocks();
        if (uVar21 < 3) {
          iVar3 = *(int *)(&DAT_001510c8 + ((ulong)pxVar14 & 0xffffffff) * 4);
        }
        pxVar14 = (xmlNodePtr)(ulong)(uVar21 + 1);
        in_RSI = (xmlNodePtr)0x0;
        xmlSchemaGetCanonValueWhtsp(0,0,iVar3);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar3 = xmlMemBlocks();
        if (iVar1 != iVar3) {
          iVar3 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlSchemaGetCanonValueWhtsp",
                 (ulong)(uint)(iVar3 - iVar1));
          iVar2 = iVar2 + 1;
          printf(" %d",0);
          printf(" %d",0);
          in_RSI = pxVar14;
          printf(" %d");
          putchar(10);
        }
      }
    }
    bVar18 = false;
  }
  function_tests = function_tests + 1;
  local_74 = local_74 + iVar2 + iVar13;
  bVar18 = true;
  while (bVar18) {
    iVar13 = xmlMemBlocks();
    xmlSchemaGetFacetValueAsULong(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar13 == iVar2) break;
    xmlMemBlocks();
    bVar18 = false;
    printf("Leak of %d blocks found in xmlSchemaGetFacetValueAsULong");
    in_RSI = (xmlNodePtr)0x0;
    printf(" %d");
    putchar(10);
    local_74 = local_74 + 1;
  }
  function_tests = function_tests + 1;
  iVar13 = 0;
  uVar9 = 0;
  while (iVar2 = (int)uVar9, iVar2 != 5) {
    pxVar14 = (xmlNodePtr)0x0;
    while( true ) {
      iVar3 = (int)in_RSI;
      iVar1 = (int)pxVar14;
      if (iVar1 == 5) break;
      iVar4 = xmlMemBlocks();
      gen_const_xmlChar_ptr(iVar2,iVar3);
      in_RSI = (xmlNodePtr)gen_const_xmlChar_ptr(iVar1,iVar3);
      xmlSchemaGetPredefinedType();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar3 = xmlMemBlocks();
      if (iVar4 != iVar3) {
        iVar3 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlSchemaGetPredefinedType",(ulong)(uint)(iVar3 - iVar4))
        ;
        iVar13 = iVar13 + 1;
        printf(" %d",uVar9);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar14;
      }
      pxVar14 = (xmlNodePtr)(ulong)(iVar1 + 1);
    }
    uVar9 = (ulong)(iVar2 + 1);
  }
  function_tests = function_tests + 1;
  local_74 = local_74 + iVar13;
  bVar18 = true;
  while (bVar18) {
    iVar13 = xmlMemBlocks();
    xmlSchemaGetValType(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar13 == iVar2) break;
    xmlMemBlocks();
    bVar18 = false;
    printf("Leak of %d blocks found in xmlSchemaGetValType");
    in_RSI = (xmlNodePtr)0x0;
    printf(" %d");
    putchar(10);
    local_74 = local_74 + 1;
  }
  function_tests = function_tests + 1;
  xmlSchemaInitTypes();
  call_tests = call_tests + 1;
  xmlResetLastError();
  function_tests = function_tests + 1;
  bVar18 = true;
  test_ret_4 = 0;
  while (bVar18) {
    pxVar14 = (xmlNodePtr)0x0;
    while( true ) {
      iVar13 = (int)in_RSI;
      iVar2 = (int)pxVar14;
      if (iVar2 == 4) break;
      iVar3 = xmlMemBlocks();
      uVar21 = gen_int(iVar2,iVar13);
      in_RSI = (xmlNodePtr)(ulong)uVar21;
      xmlSchemaIsBuiltInTypeFacet();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar13 = xmlMemBlocks();
      if (iVar3 != iVar13) {
        iVar13 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlSchemaIsBuiltInTypeFacet",
               (ulong)(uint)(iVar13 - iVar3));
        test_ret_4 = test_ret_4 + 1;
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar14;
      }
      pxVar14 = (xmlNodePtr)(ulong)(iVar2 + 1);
    }
    bVar18 = false;
  }
  function_tests = function_tests + 1;
  bVar18 = true;
  local_44 = 0;
  while (bVar18) {
    uVar9 = 0;
    while (iVar13 = (int)uVar9, iVar13 != 5) {
      bVar18 = true;
      while (bVar18) {
        pxVar14 = (xmlNodePtr)0x0;
        while( true ) {
          iVar2 = (int)in_RSI;
          iVar3 = (int)pxVar14;
          if (iVar3 == 3) break;
          iVar1 = xmlMemBlocks();
          pxVar8 = gen_const_xmlChar_ptr(iVar13,iVar2);
          in_RSI = gen_xmlNodePtr(iVar3,iVar2);
          xmlSchemaValPredefTypeNode(0,pxVar8,0);
          call_tests = call_tests + 1;
          des_xmlNodePtr(iVar3,in_RSI,nr);
          xmlResetLastError();
          iVar2 = xmlMemBlocks();
          if (iVar1 != iVar2) {
            iVar2 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlSchemaValPredefTypeNode",
                   (ulong)(uint)(iVar2 - iVar1));
            local_44 = local_44 + 1;
            printf(" %d",0);
            printf(" %d",uVar9);
            printf(" %d",0);
            printf(" %d");
            putchar(10);
            in_RSI = pxVar14;
          }
          pxVar14 = (xmlNodePtr)(ulong)(iVar3 + 1);
        }
        bVar18 = false;
      }
      uVar9 = (ulong)(iVar13 + 1);
    }
    bVar18 = false;
  }
  function_tests = function_tests + 1;
  bVar18 = true;
  local_48 = 0;
  while (bVar18) {
    uVar9 = 0;
    while (iVar13 = (int)uVar9, iVar13 != 5) {
      bVar18 = true;
      while (bVar18) {
        pxVar14 = (xmlNodePtr)0x0;
        while( true ) {
          iVar2 = (int)in_RSI;
          iVar3 = (int)pxVar14;
          if (iVar3 == 3) break;
          iVar1 = xmlMemBlocks();
          pxVar8 = gen_const_xmlChar_ptr(iVar13,iVar2);
          in_RSI = gen_xmlNodePtr(iVar3,iVar2);
          xmlSchemaValPredefTypeNodeNoNorm(0,pxVar8,0);
          call_tests = call_tests + 1;
          des_xmlNodePtr(iVar3,in_RSI,nr_00);
          xmlResetLastError();
          iVar2 = xmlMemBlocks();
          if (iVar1 != iVar2) {
            iVar2 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlSchemaValPredefTypeNodeNoNorm",
                   (ulong)(uint)(iVar2 - iVar1));
            local_48 = local_48 + 1;
            printf(" %d",0);
            printf(" %d",uVar9);
            printf(" %d",0);
            printf(" %d");
            putchar(10);
            in_RSI = pxVar14;
          }
          pxVar14 = (xmlNodePtr)(ulong)(iVar3 + 1);
        }
        bVar18 = false;
      }
      uVar9 = (ulong)(iVar13 + 1);
    }
    bVar18 = false;
  }
  function_tests = function_tests + 1;
  iVar13 = 0;
  iVar2 = 1;
  while (iVar2 != 0) {
    bVar18 = true;
    while (iVar2 = 0, bVar18) {
      for (; iVar2 != 5; iVar2 = iVar2 + 1) {
        bVar18 = true;
        while (iVar3 = (int)in_RSI, bVar18) {
          iVar1 = xmlMemBlocks();
          pxVar8 = gen_const_xmlChar_ptr(iVar2,iVar3);
          in_RSI = (xmlNodePtr)0x0;
          xmlSchemaValidateFacet(0,0,pxVar8);
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar3 = xmlMemBlocks();
          if (iVar1 == iVar3) break;
          iVar3 = xmlMemBlocks();
          bVar18 = false;
          printf("Leak of %d blocks found in xmlSchemaValidateFacet",(ulong)(uint)(iVar3 - iVar1));
          iVar13 = iVar13 + 1;
          printf(" %d",0);
          printf(" %d",0);
          printf(" %d");
          in_RSI = (xmlNodePtr)0x0;
          printf(" %d");
          putchar(10);
        }
      }
      bVar18 = false;
    }
  }
  function_tests = function_tests + 1;
  uVar9 = 1;
  local_3c = 0;
  while (uVar9 != 0) {
    uVar10 = 0;
    while( true ) {
      uVar9 = 0;
      iVar2 = (int)uVar10;
      if (iVar2 == 4) break;
      while (iVar3 = (int)uVar9, iVar3 != 4) {
        uVar19 = 0;
        while (iVar1 = (int)uVar19, iVar1 != 5) {
          pxVar14 = (xmlNodePtr)0x1;
          while (pxVar14 != (xmlNodePtr)0x0) {
            uVar21 = 0xffffffff;
            while( true ) {
              iVar4 = (int)in_RSI;
              pxVar14 = (xmlNodePtr)0x0;
              if (uVar21 == 3) break;
              iVar5 = xmlMemBlocks();
              in_RSI = pxVar14;
              if (iVar2 - 1U < 3) {
                in_RSI = (xmlNodePtr)(ulong)*(uint *)(&DAT_001510c8 + (ulong)(iVar2 - 1U) * 4);
              }
              uVar17 = 0;
              uVar20 = 0;
              if (iVar3 - 1U < 3) {
                uVar20 = *(undefined4 *)(&DAT_001510bc + (ulong)(iVar3 - 1U) * 4);
              }
              pxVar8 = gen_const_xmlChar_ptr(iVar1,iVar4);
              if (uVar21 < 3) {
                uVar17 = *(undefined4 *)(&DAT_001510c8 + (ulong)uVar21 * 4);
              }
              uVar21 = uVar21 + 1;
              xmlSchemaValidateFacetWhtsp(0,in_RSI,uVar20,pxVar8,0,uVar17);
              call_tests = call_tests + 1;
              xmlResetLastError();
              iVar4 = xmlMemBlocks();
              if (iVar5 != iVar4) {
                iVar4 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlSchemaValidateFacetWhtsp",
                       (ulong)(uint)(iVar4 - iVar5));
                local_3c = local_3c + 1;
                printf(" %d",0);
                printf(" %d",uVar10);
                printf(" %d",uVar9);
                printf(" %d",uVar19);
                printf(" %d",0);
                in_RSI = (xmlNodePtr)(ulong)uVar21;
                printf(" %d");
                putchar(10);
              }
            }
          }
          uVar19 = (ulong)(iVar1 + 1);
        }
        uVar9 = (ulong)(iVar3 + 1);
      }
      uVar10 = (ulong)(iVar2 + 1);
    }
  }
  function_tests = function_tests + 1;
  uVar9 = 1;
  test_ret_5 = 0;
  while (uVar9 != 0) {
    bVar18 = true;
    while (uVar9 = 0, bVar18) {
      while (iVar2 = (int)uVar9, iVar2 != 5) {
        bVar18 = true;
        while (bVar18) {
          pxVar14 = (xmlNodePtr)0x0;
          while( true ) {
            iVar3 = (int)in_RSI;
            iVar1 = (int)pxVar14;
            if (iVar1 == 2) break;
            iVar4 = xmlMemBlocks();
            pxVar8 = gen_const_xmlChar_ptr(iVar2,iVar3);
            uVar15 = 0;
            if (iVar1 == 0) {
              uVar15 = 0x1678f0;
            }
            in_RSI = (xmlNodePtr)0x0;
            xmlSchemaValidateLengthFacet(0,0,pxVar8,0,uVar15);
            call_tests = call_tests + 1;
            xmlResetLastError();
            iVar3 = xmlMemBlocks();
            if (iVar4 != iVar3) {
              iVar3 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlSchemaValidateLengthFacet",
                     (ulong)(uint)(iVar3 - iVar4));
              test_ret_5 = test_ret_5 + 1;
              printf(" %d",0);
              printf(" %d",0);
              printf(" %d",uVar9);
              printf(" %d",0);
              printf(" %d");
              putchar(10);
              in_RSI = pxVar14;
            }
            pxVar14 = (xmlNodePtr)(ulong)(iVar1 + 1);
          }
          bVar18 = false;
        }
        uVar9 = (ulong)(iVar2 + 1);
      }
      bVar18 = false;
    }
  }
  function_tests = function_tests + 1;
  pcVar12 = "n xmlSchemaValPredefTypeNode";
  iVar2 = 0;
  while (((ulong)pcVar12 & 1) != 0) {
    uVar9 = 0;
    while( true ) {
      pcVar12 = (char *)0x0;
      iVar3 = (int)uVar9;
      if (iVar3 == 4) break;
      while (iVar1 = (int)pcVar12, iVar1 != 5) {
        bVar18 = true;
        while (bVar18) {
          for (iVar4 = 0; iVar4 != 2; iVar4 = iVar4 + 1) {
            uVar15 = 0;
            if (iVar4 == 0) {
              uVar15 = 0x1678f0;
            }
            uVar21 = 0xffffffff;
            while (iVar5 = (int)in_RSI, uVar21 != 3) {
              iVar6 = xmlMemBlocks();
              uVar20 = 0;
              in_RSI = (xmlNodePtr)0x0;
              if (iVar3 - 1U < 3) {
                in_RSI = (xmlNodePtr)(ulong)*(uint *)(&DAT_001510bc + (ulong)(iVar3 - 1U) * 4);
              }
              pxVar8 = gen_const_xmlChar_ptr(iVar1,iVar5);
              if (uVar21 < 3) {
                uVar20 = *(undefined4 *)(&DAT_001510c8 + (ulong)uVar21 * 4);
              }
              uVar21 = uVar21 + 1;
              xmlSchemaValidateLengthFacetWhtsp(0,in_RSI,pxVar8,0,uVar15,uVar20);
              call_tests = call_tests + 1;
              xmlResetLastError();
              iVar5 = xmlMemBlocks();
              if (iVar6 != iVar5) {
                iVar5 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlSchemaValidateLengthFacetWhtsp",
                       (ulong)(uint)(iVar5 - iVar6));
                iVar2 = iVar2 + 1;
                printf(" %d",0);
                printf(" %d",uVar9);
                printf(" %d",pcVar12);
                printf(" %d",0);
                printf(" %d",iVar4);
                in_RSI = (xmlNodePtr)(ulong)uVar21;
                printf(" %d");
                putchar(10);
              }
            }
          }
          bVar18 = false;
        }
        pcVar12 = (char *)(ulong)(iVar1 + 1);
      }
      uVar9 = (ulong)(iVar3 + 1);
    }
  }
  function_tests = function_tests + 1;
  uVar9 = 1;
  iVar3 = 0;
  while (uVar9 != 0) {
    uVar10 = 0;
    while( true ) {
      uVar9 = 0;
      iVar1 = (int)uVar10;
      if (iVar1 == 5) break;
      while (uVar21 = (uint)uVar9, uVar21 != 4) {
        pxVar14 = (xmlNodePtr)0x0;
        while( true ) {
          iVar4 = (int)in_RSI;
          iVar5 = (int)pxVar14;
          if (iVar5 == 2) break;
          iVar6 = xmlMemBlocks();
          in_RSI = (xmlNodePtr)gen_const_xmlChar_ptr(iVar1,iVar4);
          uVar15 = 0xffffffffffffffff;
          if (uVar21 < 3) {
            uVar15 = (&DAT_001510d8)[uVar9];
          }
          uVar11 = 0;
          if (iVar5 == 0) {
            uVar11 = 0x1678e8;
          }
          xmlSchemaValidateListSimpleTypeFacet(0,in_RSI,uVar15,uVar11);
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar4 = xmlMemBlocks();
          if (iVar6 != iVar4) {
            iVar4 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlSchemaValidateListSimpleTypeFacet",
                   (ulong)(uint)(iVar4 - iVar6));
            iVar3 = iVar3 + 1;
            printf(" %d",0);
            printf(" %d",uVar10);
            printf(" %d",uVar9);
            printf(" %d");
            putchar(10);
            in_RSI = pxVar14;
          }
          pxVar14 = (xmlNodePtr)(ulong)(iVar5 + 1);
        }
        uVar9 = (ulong)(uVar21 + 1);
      }
      uVar10 = (ulong)(iVar1 + 1);
    }
  }
  function_tests = function_tests + 1;
  iVar1 = 0;
  bVar18 = true;
  while (bVar18) {
    for (iVar4 = 0; iVar4 != 5; iVar4 = iVar4 + 1) {
      bVar18 = true;
      while (iVar5 = (int)in_RSI, bVar18) {
        iVar6 = xmlMemBlocks();
        in_RSI = (xmlNodePtr)gen_const_xmlChar_ptr(iVar4,iVar5);
        xmlSchemaValidatePredefinedType(0,in_RSI,0);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar5 = xmlMemBlocks();
        if (iVar6 == iVar5) break;
        iVar5 = xmlMemBlocks();
        bVar18 = false;
        printf("Leak of %d blocks found in xmlSchemaValidatePredefinedType",
               (ulong)(uint)(iVar5 - iVar6));
        iVar1 = iVar1 + 1;
        printf(" %d",0);
        printf(" %d");
        in_RSI = (xmlNodePtr)0x0;
        printf(" %d");
        putchar(10);
      }
    }
    bVar18 = false;
  }
  function_tests = function_tests + 1;
  iVar4 = 0;
  bVar18 = true;
LAB_001412f6:
  if (bVar18) {
    bVar18 = true;
    while (bVar18) {
      iVar5 = xmlMemBlocks();
      bVar18 = false;
      in_RSI = (xmlNodePtr)0x0;
      xmlSchemaValueAppend();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar6 = xmlMemBlocks();
      if (iVar5 == iVar6) goto LAB_001412f6;
      xmlMemBlocks();
      bVar18 = false;
      printf("Leak of %d blocks found in xmlSchemaValueAppend");
      iVar4 = iVar4 + 1;
      printf(" %d");
      in_RSI = (xmlNodePtr)0x0;
      printf(" %d");
      putchar(10);
    }
    bVar18 = false;
    goto LAB_001412f6;
  }
  function_tests = function_tests + 1;
  iVar13 = iVar3 + iVar1 + iVar4 + local_74 +
           local_3c + test_ret_5 + iVar2 + local_48 + iVar13 + test_ret_4 + local_44;
  bVar18 = true;
  while (bVar18) {
    iVar2 = xmlMemBlocks();
    xmlSchemaValueGetAsBoolean(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar3 = xmlMemBlocks();
    if (iVar2 == iVar3) break;
    xmlMemBlocks();
    bVar18 = false;
    printf("Leak of %d blocks found in xmlSchemaValueGetAsBoolean");
    in_RSI = (xmlNodePtr)0x0;
    printf(" %d");
    putchar(10);
    iVar13 = iVar13 + 1;
  }
  function_tests = function_tests + 1;
  bVar18 = true;
  while (bVar18) {
    iVar2 = xmlMemBlocks();
    xmlSchemaValueGetAsString(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar3 = xmlMemBlocks();
    if (iVar2 == iVar3) break;
    xmlMemBlocks();
    bVar18 = false;
    printf("Leak of %d blocks found in xmlSchemaValueGetAsString");
    in_RSI = (xmlNodePtr)0x0;
    printf(" %d");
    putchar(10);
    iVar13 = iVar13 + 1;
  }
  function_tests = function_tests + 1;
  iVar2 = 0;
  for (uVar21 = 0; uVar21 != 5; uVar21 = uVar21 + 1) {
    iVar3 = xmlMemBlocks();
    pxVar8 = gen_const_xmlChar_ptr(uVar21,(int)in_RSI);
    lVar7 = xmlSchemaWhiteSpaceReplace(pxVar8);
    if (lVar7 != 0) {
      (*_xmlFree)(lVar7);
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar1 = xmlMemBlocks();
    if (iVar3 != iVar1) {
      iVar1 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSchemaWhiteSpaceReplace",(ulong)(uint)(iVar1 - iVar3));
      iVar2 = iVar2 + 1;
      in_RSI = (xmlNodePtr)(ulong)uVar21;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  uVar21 = iVar13 + iVar2;
  if (uVar21 != 0) {
    printf("Module xmlschemastypes: %d errors\n",(ulong)uVar21);
  }
  return uVar21;
}

Assistant:

static int
test_xmlschemastypes(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing xmlschemastypes : 26 of 34 functions ...\n");
    test_ret += test_xmlSchemaCheckFacet();
    test_ret += test_xmlSchemaCleanupTypes();
    test_ret += test_xmlSchemaCollapseString();
    test_ret += test_xmlSchemaCompareValues();
    test_ret += test_xmlSchemaCompareValuesWhtsp();
    test_ret += test_xmlSchemaCopyValue();
    test_ret += test_xmlSchemaGetBuiltInListSimpleTypeItemType();
    test_ret += test_xmlSchemaGetBuiltInType();
    test_ret += test_xmlSchemaGetCanonValue();
    test_ret += test_xmlSchemaGetCanonValueWhtsp();
    test_ret += test_xmlSchemaGetFacetValueAsULong();
    test_ret += test_xmlSchemaGetPredefinedType();
    test_ret += test_xmlSchemaGetValType();
    test_ret += test_xmlSchemaInitTypes();
    test_ret += test_xmlSchemaIsBuiltInTypeFacet();
    test_ret += test_xmlSchemaNewFacet();
    test_ret += test_xmlSchemaNewNOTATIONValue();
    test_ret += test_xmlSchemaNewQNameValue();
    test_ret += test_xmlSchemaNewStringValue();
    test_ret += test_xmlSchemaValPredefTypeNode();
    test_ret += test_xmlSchemaValPredefTypeNodeNoNorm();
    test_ret += test_xmlSchemaValidateFacet();
    test_ret += test_xmlSchemaValidateFacetWhtsp();
    test_ret += test_xmlSchemaValidateLengthFacet();
    test_ret += test_xmlSchemaValidateLengthFacetWhtsp();
    test_ret += test_xmlSchemaValidateListSimpleTypeFacet();
    test_ret += test_xmlSchemaValidatePredefinedType();
    test_ret += test_xmlSchemaValueAppend();
    test_ret += test_xmlSchemaValueGetAsBoolean();
    test_ret += test_xmlSchemaValueGetAsString();
    test_ret += test_xmlSchemaValueGetNext();
    test_ret += test_xmlSchemaWhiteSpaceReplace();

    if (test_ret != 0)
	printf("Module xmlschemastypes: %d errors\n", test_ret);
    return(test_ret);
}